

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall wallet::CWallet::Flush(CWallet *this)

{
  WalletDatabase *pWVar1;
  long in_FS_OFFSET;
  
  pWVar1 = (this->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  if (pWVar1 == (WalletDatabase *)0x0) {
    __assert_fail("static_cast<bool>(m_database)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    (*pWVar1->_vptr_WalletDatabase[7])();
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::Flush()
{
    GetDatabase().Flush();
}